

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void write_num_bytes(CVmDataSource *dst,char *buf,CVmPackType *t,size_t len)

{
  int iVar1;
  
  if ((1 < len) && (t->big_endian != 0)) {
    reverse_bytes(buf,len);
  }
  iVar1 = (*dst->_vptr_CVmDataSource[4])(dst,buf,len);
  if (iVar1 == 0) {
    return;
  }
  err_throw(0x66);
}

Assistant:

static void write_num_bytes(class CVmDataSource *dst,
                            char *buf, const CVmPackType *t, size_t len)
{
    /* 
     *   we always prepare our buffers in our standard little-endian byte
     *   order, so if the type has a big-endian flag, we need to reverse the
     *   byte order
     */
    if (len > 1 && t->big_endian)
        reverse_bytes(buf, len);

    /* write the bytes */
    if (dst->write(buf, len))
        err_throw(VMERR_WRITE_FILE);
}